

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

void __thiscall
trieste::detail::Choice<false>::Choice(Choice<false> *this,PatternPtr *first_,PatternPtr *second_)

{
  bool bVar1;
  runtime_error *this_00;
  
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)&PTR__Choice_00251228;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->first).
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>,
             &first_->super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>);
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->second).
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>,
             &second_->super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = PatternDef::has_captures
                    ((this->first).
                     super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (!bVar1) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Static and dynamic view of captures disagree.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Choice(PatternPtr first_, PatternPtr second_)
      : first(first_), second(second_)
      {
        if (CapturesLeft != first->has_captures())
          throw std::runtime_error(
            "Static and dynamic view of captures disagree.");
      }